

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_create_term(lysc_node *schema,char *value,size_t value_len,ly_bool is_utf8,
                      ly_bool store_only,ly_bool *dynamic,LY_VALUE_FORMAT format,void *prefix_data,
                      uint32_t hints,ly_bool *incomplete,lyd_node **node)

{
  LY_ERR LVar1;
  lyd_node *node_00;
  LY_ERR LVar2;
  
  if ((schema->nodetype & 0xc) != 0) {
    node_00 = (lyd_node *)calloc(1,0x60);
    if (node_00 == (lyd_node *)0x0) {
      LVar2 = LY_EMEM;
      ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_create_term");
    }
    else {
      node_00->schema = schema;
      node_00->prev = node_00;
      node_00->flags = 4;
      LVar2 = LY_SUCCESS;
      ly_log_location(schema,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      LVar1 = lyd_value_store(schema->module->ctx,(lyd_value *)(node_00 + 1),
                              (lysc_type *)node_00->schema[1].parent,value,value_len,is_utf8,
                              store_only,dynamic,format,prefix_data,hints,schema,incomplete);
      ly_log_location_revert(1,0,0,0);
      if (LVar1 == LY_SUCCESS) {
        lyd_hash(node_00);
        *node = node_00;
      }
      else {
        free(node_00);
        LVar2 = LVar1;
      }
    }
    return LVar2;
  }
  __assert_fail("schema->nodetype & LYD_NODE_TERM",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                ,0x3d,
                "LY_ERR lyd_create_term(const struct lysc_node *, const char *, size_t, ly_bool, ly_bool, ly_bool *, LY_VALUE_FORMAT, void *, uint32_t, ly_bool *, struct lyd_node **)"
               );
}

Assistant:

LY_ERR
lyd_create_term(const struct lysc_node *schema, const char *value, size_t value_len, ly_bool is_utf8, ly_bool store_only,
        ly_bool *dynamic, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, ly_bool *incomplete, struct lyd_node **node)
{
    LY_ERR ret;
    struct lyd_node_term *term;

    assert(schema->nodetype & LYD_NODE_TERM);

    term = calloc(1, sizeof *term);
    LY_CHECK_ERR_RET(!term, LOGMEM(schema->module->ctx), LY_EMEM);

    term->schema = schema;
    term->prev = &term->node;
    term->flags = LYD_NEW;

    LOG_LOCSET(schema, NULL);
    ret = lyd_value_store(schema->module->ctx, &term->value, ((struct lysc_node_leaf *)term->schema)->type, value,
            value_len, is_utf8, store_only, dynamic, format, prefix_data, hints, schema, incomplete);
    LOG_LOCBACK(1, 0);
    LY_CHECK_ERR_RET(ret, free(term), ret);
    lyd_hash(&term->node);

    *node = &term->node;
    return ret;
}